

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_region_init_arm(TCGContext_conflict *tcg_ctx)

{
  size_t size;
  GTree *pGVar1;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  
  pvVar5 = tcg_ctx->code_gen_buffer;
  size = tcg_ctx->uc->qemu_real_host_page_size;
  uVar3 = (long)pvVar5 + (size - 1);
  pvVar4 = (void *)(uVar3 - uVar3 % size);
  pvVar2 = (void *)(tcg_ctx->code_gen_buffer_size + (long)pvVar5);
  uVar3 = (long)pvVar2 - (long)pvVar4;
  if (pvVar2 < pvVar4 || uVar3 == 0) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
               ,0x1fc,"(char *)aligned < ((char *)tcg_ctx->code_gen_buffer + size)");
  }
  uVar3 = uVar3 - uVar3 % size;
  if (uVar3 < size * 2) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
               ,0x206,"region_size >= 2 * page_size");
  }
  (tcg_ctx->region).n = 1;
  (tcg_ctx->region).size = uVar3 - size;
  (tcg_ctx->region).stride = uVar3;
  (tcg_ctx->region).start = pvVar5;
  (tcg_ctx->region).start_aligned = pvVar4;
  (tcg_ctx->region).end = (void *)((long)pvVar2 + (-size - (ulong)pvVar2 % size));
  uVar3 = 1;
  uVar6 = 0;
  do {
    if (uVar6 == uVar3 - 1) {
      pvVar5 = (tcg_ctx->region).end;
    }
    else {
      pvVar5 = (void *)((long)(tcg_ctx->region).start_aligned +
                       (tcg_ctx->region).size + (tcg_ctx->region).stride * uVar6);
    }
    qemu_mprotect_none(pvVar5,size);
    uVar6 = uVar6 + 1;
    uVar3 = (tcg_ctx->region).n;
  } while (uVar6 < uVar3);
  pGVar1 = g_tree_new(tb_tc_cmp);
  tcg_ctx->tree = pGVar1;
  return;
}

Assistant:

void tcg_region_init(TCGContext *tcg_ctx)
{
    void *buf = tcg_ctx->code_gen_buffer;
    void *aligned;
    size_t size = tcg_ctx->code_gen_buffer_size;
    size_t page_size = tcg_ctx->uc->qemu_real_host_page_size;
    size_t region_size;
    size_t n_regions;
    size_t i;

    n_regions = 1;

    /* The first region will be 'aligned - buf' bytes larger than the others */
    aligned = (void *)QEMU_ALIGN_PTR_UP(buf, page_size);
    g_assert((char *)aligned < ((char *)tcg_ctx->code_gen_buffer + size));
    /*
     * Make region_size a multiple of page_size, using aligned as the start.
     * As a result of this we might end up with a few extra pages at the end of
     * the buffer; we will assign those to the last region.
     */
    region_size = (size - ((char *)aligned - (char *)buf)) / n_regions;
    region_size = QEMU_ALIGN_DOWN(region_size, page_size);

    /* A region must have at least 2 pages; one code, one guard */
    g_assert(region_size >= 2 * page_size);

    /* init the region struct */
    tcg_ctx->region.n = n_regions;
    tcg_ctx->region.size = region_size - page_size;
    tcg_ctx->region.stride = region_size;
    tcg_ctx->region.start = buf;
    tcg_ctx->region.start_aligned = aligned;
    /* page-align the end, since its last page will be a guard page */
    tcg_ctx->region.end = (void *)QEMU_ALIGN_PTR_DOWN((char *)buf + size, page_size);
    /* account for that last guard page */
    tcg_ctx->region.end = (void *)((char *)tcg_ctx->region.end - page_size);

    /* set guard pages */
    for (i = 0; i < tcg_ctx->region.n; i++) {
        void *start, *end;

        tcg_region_bounds(tcg_ctx, i, &start, &end);

        (void)qemu_mprotect_none(end, page_size);
    }

    tcg_ctx->tree = g_tree_new(tb_tc_cmp);

}